

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbc.c
# Opt level: O1

void Wlc_NtkPrintInvStats(Wlc_Ntk_t *pNtk,Vec_Int_t *vCounts,int fVerbose)

{
  int iObj;
  Wlc_Obj_t *pWVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar10;
  long lVar11;
  int iVar9;
  
  if ((pNtk->vCis).nSize < 1) {
    uVar10 = 0;
  }
  else {
    lVar11 = 0;
    uVar10 = 0;
    do {
      iObj = (pNtk->vCis).pArray[lVar11];
      lVar5 = (long)iObj;
      if ((lVar5 < 1) || (pNtk->nObjsAlloc <= iObj)) {
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      pWVar1 = pNtk->pObjs;
      if ((undefined1  [24])((undefined1  [24])pWVar1[lVar5] & (undefined1  [24])0x3f) ==
          (undefined1  [24])0x3) {
        iVar2 = pWVar1[lVar5].End - pWVar1[lVar5].Beg;
        iVar9 = -iVar2;
        if (0 < iVar2) {
          iVar9 = iVar2;
        }
        uVar8 = iVar9 + 1;
        uVar7 = (ulong)uVar8;
        uVar6 = (ulong)uVar10;
        uVar3 = 0;
        do {
          if ((long)vCounts->nSize <= (long)(uVar6 + uVar3)) goto LAB_0085cdb7;
        } while ((vCounts->pArray[uVar6 + uVar3] == 0) && (uVar3 = uVar3 + 1, uVar7 != uVar3));
        if (uVar8 == (uint)uVar3) {
          uVar10 = uVar8 + uVar10;
        }
        else {
          pcVar4 = Wlc_ObjName(pNtk,iObj);
          uVar3 = 0;
          printf("%s[%d:%d] : ",pcVar4,(ulong)(uint)pWVar1[lVar5].End,(ulong)(uint)pWVar1[lVar5].Beg
                );
          do {
            if (vCounts->nSize <= (int)uVar6) {
LAB_0085cdb7:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            if (vCounts->pArray[uVar6] != 0) {
              printf("  [%d] -> %d",uVar3);
            }
            uVar3 = (ulong)((int)uVar3 + 1);
            uVar6 = uVar6 + 1;
            uVar7 = uVar7 - 1;
          } while (uVar7 != 0);
          putchar(10);
          uVar10 = uVar8 + uVar10;
        }
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < (pNtk->vCis).nSize);
  }
  if (vCounts->nSize != uVar10) {
    __assert_fail("Vec_IntSize(vCounts) == nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcAbc.c"
                  ,0x81,"void Wlc_NtkPrintInvStats(Wlc_Ntk_t *, Vec_Int_t *, int)");
  }
  return;
}

Assistant:

void Wlc_NtkPrintInvStats( Wlc_Ntk_t * pNtk, Vec_Int_t * vCounts, int fVerbose )
{
    Wlc_Obj_t * pObj;
    int i, k, nNum, nRange, nBits = 0;
    Wlc_NtkForEachCi( pNtk, pObj, i )
    {
        if ( pObj->Type != WLC_OBJ_FO )
            continue;
        nRange = Wlc_ObjRange(pObj);
        for ( k = 0; k < nRange; k++ )
        {
            nNum = Vec_IntEntry(vCounts, nBits + k);
            if ( nNum )
                break;
        }
        if ( k == nRange )
        {
            nBits += nRange;
            continue;
        }
        printf( "%s[%d:%d] : ", Wlc_ObjName(pNtk, Wlc_ObjId(pNtk, pObj)), pObj->End, pObj->Beg );
        for ( k = 0; k < nRange; k++ )
        {
            nNum = Vec_IntEntry( vCounts, nBits + k );
            if ( nNum == 0 )
                continue;
            printf( "  [%d] -> %d", k, nNum );
        }
        printf( "\n");
        nBits += nRange;
    }
    //printf( "%d %d\n", Vec_IntSize(vCounts), nBits );
    assert( Vec_IntSize(vCounts) == nBits );
}